

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

TypeCast * soul::ResolutionPass::convertToCast(Allocator *a,CallOrCast *call,Type *destType)

{
  bool bVar1;
  size_t sVar2;
  pool_ref<soul::AST::Expression> *args_2;
  CommaSeparatedList *pCVar3;
  byte local_49;
  pool_ptr<soul::AST::CommaSeparatedList> local_38;
  pool_ptr<soul::AST::CommaSeparatedList> local_30;
  pool_ptr<soul::AST::CommaSeparatedList> list;
  Type *destType_local;
  CallOrCast *call_local;
  Allocator *a_local;
  
  list.object = (CommaSeparatedList *)destType;
  bVar1 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                    (&(call->super_CallOrCastBase).arguments,(void *)0x0);
  local_49 = 0;
  if (bVar1) {
    local_49 = (call->super_CallOrCastBase).isMethodCall ^ 0xff;
  }
  checkAssertion((bool)(local_49 & 1),"call.arguments != nullptr && ! call.isMethodCall",
                 "convertToCast",0x130);
  local_38.object = (call->super_CallOrCastBase).arguments.object;
  cast<soul::AST::CommaSeparatedList,soul::AST::CommaSeparatedList>((soul *)&local_30,&local_38);
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_38);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
  if (bVar1) {
    pCVar3 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_30);
    sVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size(&pCVar3->items)
    ;
    if (sVar2 == 1) {
      pCVar3 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_30);
      args_2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front
                         (&pCVar3->items);
      a_local = (Allocator *)
                AST::Allocator::
                allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::pool_ref<soul::AST::Expression>&>
                          (a,&(call->super_CallOrCastBase).super_Expression.super_Statement.
                              super_ASTObject.context,destType,args_2);
      bVar1 = true;
      goto LAB_0043458f;
    }
  }
  bVar1 = false;
LAB_0043458f:
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_30);
  if (!bVar1) {
    pCVar3 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                       (&(call->super_CallOrCastBase).arguments);
    a_local = (Allocator *)
              AST::Allocator::
              allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
                        (a,&(call->super_CallOrCastBase).super_Expression.super_Statement.
                            super_ASTObject.context,destType,pCVar3);
  }
  return (TypeCast *)a_local;
}

Assistant:

static AST::TypeCast& convertToCast (AST::Allocator& a, AST::CallOrCast& call, Type destType)
    {
        SOUL_ASSERT (call.arguments != nullptr && ! call.isMethodCall);

        if (auto list = cast<AST::CommaSeparatedList> (call.arguments))
            if (list->items.size() == 1)
                return a.allocate<AST::TypeCast> (call.context, std::move (destType), list->items.front());

        return a.allocate<AST::TypeCast> (call.context, std::move (destType), *call.arguments);
    }